

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     unguarded_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
               (undefined8 param_1,undefined8 param_2)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  T tmp;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> sift_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> sift;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> cur;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  less<double> local_11;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (!bVar1) {
    local_20 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_ffffffffffffffb8,(difference_type)in_stack_ffffffffffffffb0);
    while (bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar1
          ) {
      local_28._M_current = local_20._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator-(in_stack_ffffffffffffffb8,(difference_type)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb8 =
           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
           __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_28);
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_30);
      bVar1 = std::less<double>::operator()(&local_11,(double *)in_stack_ffffffffffffffb8,pdVar2);
      if (bVar1) {
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_28);
        local_38 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   *pdVar2;
        do {
          pdVar2 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_30);
          in_stack_ffffffffffffffb0 =
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)*pdVar2
          ;
          local_40 = __gnu_cxx::
                     __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                     operator--(in_stack_ffffffffffffffb8,
                                (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          pdVar2 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_40);
          *pdVar2 = (double)in_stack_ffffffffffffffb0;
          this = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator--(&local_30);
          pdVar2 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(this);
          bVar1 = std::less<double>::operator()(&local_11,(double *)&local_38,pdVar2);
        } while (bVar1);
        in_stack_ffffffffffffffa8 = local_38;
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_28);
        *pdVar2 = (double)in_stack_ffffffffffffffa8;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_20);
    }
  }
  return;
}

Assistant:

inline void unguarded_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }